

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O0

void __thiscall DetectorSS::~DetectorSS(DetectorSS *this)

{
  void *pvVar1;
  long in_RDI;
  int i;
  vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  *this_00;
  undefined4 local_c;
  
  if (*(void **)(in_RDI + 0x38) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x38));
  }
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x20); local_c = local_c + 1) {
    pvVar1 = *(void **)(*(long *)(in_RDI + 0x28) + (long)local_c * 8);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
    pvVar1 = *(void **)(*(long *)(in_RDI + 0x30) + (long)local_c * 8);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
    pvVar1 = *(void **)(*(long *)(in_RDI + 0x10) + (long)local_c * 8);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
  }
  this_00 = *(vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
              **)(in_RDI + 0x18);
  if (this_00 !=
      (vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
       *)0x0) {
    operator_delete__(this_00);
  }
  if (*(void **)(in_RDI + 0x10) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x10));
  }
  if (*(void **)(in_RDI + 0x28) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x28));
  }
  if (*(void **)(in_RDI + 0x30) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x30));
  }
  std::
  vector<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ::~vector(this_00);
  return;
}

Assistant:

DetectorSS::~DetectorSS() {
	delete[] ss_.hash;
	for (int i = 0; i < ss_.depth; i++) {
		delete[] ss_.skey[i];
		delete[] ss_.level[i];
		delete[] ss_.counts[i];
	}
	delete[] ss_.offsets;
	delete[] ss_.counts;
	delete[] ss_.skey;
	delete[] ss_.level;
#ifdef HH
	delete[] ss_.key;
	delete[] ss_.indicator;
#endif
}